

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O2

quint32 __thiscall
HPack::FieldLookupTable::indexOf(FieldLookupTable *this,QByteArray *name,QByteArray *value)

{
  QByteArray *lhs;
  bool bVar1;
  const_iterator lhs_00;
  const_iterator cVar2;
  quint32 qVar3;
  long in_FS_OFFSET;
  key_type local_88;
  HeaderField local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  staticPart();
  local_68.value.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_68.value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.name.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  HeaderField::HeaderField(&local_68,name,value);
  lhs_00 = findInStaticPart(&local_68,nameAndValue);
  if (lhs_00._M_current !=
      staticPart::table.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = ::operator==(&(lhs_00._M_current)->name,name);
    if (bVar1) {
      bVar1 = ::operator==(&(lhs_00._M_current)->value,value);
      if (bVar1) {
        qVar3 = (int)(((long)lhs_00._M_current -
                      (long)staticPart::table.
                            super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30) + 1;
        goto LAB_001cda59;
      }
    }
  }
  if (this->useIndex == false) {
    local_88.field._0_4_ = 2;
    local_88._20_4_ = 0;
    local_88.field._4_4_ = 0;
    local_88.chunk._0_4_ = 0;
    local_88.chunk._4_4_ = 0;
    local_88.offset = 0;
    local_88.table = (FieldLookupTable *)0x23d1aa;
    qVar3 = 0;
    QMessageLogger::critical
              ((char *)&local_88,"lookup in dynamic table requires search index enabled");
  }
  else {
    local_88._20_4_ = 0xaaaaaaaa;
    local_88.chunk._0_4_ = 0;
    local_88.chunk._4_4_ = 0;
    local_88.offset = 0;
    local_88.table = this;
    local_88.field = &local_68;
    cVar2 = std::
            _Rb_tree<HPack::FieldLookupTable::SearchEntry,_HPack::FieldLookupTable::SearchEntry,_std::_Identity<HPack::FieldLookupTable::SearchEntry>,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
            ::lower_bound(&(this->searchIndex)._M_t,&local_88);
    qVar3 = 0;
    if ((_Rb_tree_header *)cVar2._M_node != &(this->searchIndex)._M_t._M_impl.super__Rb_tree_header)
    {
      lhs = *(QByteArray **)(cVar2._M_node + 1);
      bVar1 = ::operator==(lhs,name);
      if (bVar1) {
        bVar1 = ::operator==(lhs + 1,value);
        if (bVar1) {
          qVar3 = keyToIndex(this,(SearchEntry *)(cVar2._M_node + 1));
        }
      }
    }
  }
LAB_001cda59:
  HeaderField::~HeaderField(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar3;
  }
  __stack_chk_fail();
}

Assistant:

quint32 FieldLookupTable::indexOf(const QByteArray &name, const QByteArray &value)const
{
    // Start from the static part first:
    const auto &table = staticPart();
    const HeaderField field(name, value);
    const auto staticPos = findInStaticPart(field, CompareMode::nameAndValue);
    if (staticPos != table.end()) {
        if (staticPos->name == name && staticPos->value == value)
            return quint32(staticPos - table.begin() + 1);
    }

    // Now we have to lookup in our dynamic part ...
    if (!useIndex) {
        qCritical("lookup in dynamic table requires search index enabled");
        return 0;
    }

    const SearchEntry key(&field, nullptr, 0, this);
    const auto pos = searchIndex.lower_bound(key);
    if (pos != searchIndex.end()) {
        const HeaderField &found = *pos->field;
        if (found.name == name && found.value == value)
            return keyToIndex(*pos);
    }

    return 0;
}